

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

unique_ptr<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>_>
 __thiscall spvtools::opt::analysis::ArrayConstant::CopyArrayConstant(ArrayConstant *this)

{
  long in_RSI;
  Array *local_18;
  
  local_18 = (Array *)(**(code **)(**(long **)(in_RSI + 8) + 0xc0))();
  MakeUnique<spvtools::opt::analysis::ArrayConstant,spvtools::opt::analysis::Array_const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>const&>
            ((spvtools *)this,&local_18,
             (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              *)(in_RSI + 0x10));
  return (__uniq_ptr_data<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ArrayConstant> CopyArrayConstant() const {
    return MakeUnique<ArrayConstant>(type_->AsArray(), components_);
  }